

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O0

__m128i convolve_lo_x(__m128i *s,__m128i *coeffs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __m128i *in_RSI;
  undefined8 *in_RDI;
  undefined1 in_XMM0_Be;
  undefined1 in_XMM0_Bf;
  undefined1 in_XMM0_Bg;
  undefined1 in_XMM0_Bh;
  undefined1 in_XMM0_Bi;
  undefined1 in_XMM0_Bj;
  undefined1 in_XMM0_Bk;
  undefined1 in_XMM0_Bl;
  undefined1 in_XMM0_Bm;
  undefined1 in_XMM0_Bn;
  undefined1 in_XMM0_Bo;
  undefined1 in_XMM0_Bp;
  __m128i alVar8;
  __m128i ss [4];
  undefined1 local_118;
  undefined1 uStack_117;
  undefined1 uStack_116;
  undefined1 uStack_115;
  undefined1 uStack_114;
  undefined1 uStack_113;
  undefined1 uStack_112;
  undefined1 uStack_111;
  undefined1 uStack_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  undefined1 local_108;
  undefined1 uStack_107;
  undefined1 uStack_106;
  undefined1 uStack_105;
  undefined1 uStack_104;
  undefined1 uStack_103;
  undefined1 uStack_102;
  undefined1 uStack_101;
  undefined1 uStack_100;
  undefined1 uStack_ff;
  undefined1 uStack_fe;
  undefined1 uStack_fd;
  undefined1 uStack_fc;
  undefined1 uStack_fb;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  undefined1 local_e8;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  undefined1 uStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  undefined1 uStack_e0;
  undefined1 uStack_df;
  undefined1 uStack_de;
  undefined1 uStack_dd;
  undefined1 uStack_dc;
  undefined1 uStack_db;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  long local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  long local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 local_28;
  undefined1 uStack_27;
  undefined1 uStack_26;
  undefined1 uStack_25;
  undefined1 uStack_24;
  undefined1 uStack_23;
  undefined1 uStack_22;
  undefined1 uStack_21;
  undefined1 uStack_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  undefined1 uStack_1c;
  undefined1 uStack_1b;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  uVar4 = *in_RDI;
  uStack_50 = in_RDI[1];
  uVar1 = CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be))) ^
          CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be)));
  uStack_10f = (undefined1)uVar1;
  uStack_10d = (undefined1)(uVar1 >> 8);
  uStack_10b = (undefined1)(uVar1 >> 0x10);
  uStack_109 = (undefined1)(uVar1 >> 0x18);
  uVar2 = CONCAT13(in_XMM0_Bl,CONCAT12(in_XMM0_Bk,CONCAT11(in_XMM0_Bj,in_XMM0_Bi))) ^
          CONCAT13(in_XMM0_Bl,CONCAT12(in_XMM0_Bk,CONCAT11(in_XMM0_Bj,in_XMM0_Bi)));
  uStack_40 = (undefined1)uVar2;
  uStack_3f = (undefined1)(uVar2 >> 8);
  uStack_3e = (undefined1)(uVar2 >> 0x10);
  uStack_3d = (undefined1)(uVar2 >> 0x18);
  uVar3 = CONCAT13(in_XMM0_Bp,CONCAT12(in_XMM0_Bo,CONCAT11(in_XMM0_Bn,in_XMM0_Bm))) ^
          CONCAT13(in_XMM0_Bp,CONCAT12(in_XMM0_Bo,CONCAT11(in_XMM0_Bn,in_XMM0_Bm)));
  uStack_3c = (undefined1)uVar3;
  uStack_3b = (undefined1)(uVar3 >> 8);
  uStack_3a = (undefined1)(uVar3 >> 0x10);
  uStack_39 = (undefined1)(uVar3 >> 0x18);
  local_18 = 0;
  uStack_17 = 0;
  uStack_16 = 0;
  uStack_15 = 0;
  local_68 = (ulong)uVar1 << 0x20;
  uStack_60 = CONCAT17(uStack_39,CONCAT16(uStack_3a,CONCAT15(uStack_3b,CONCAT14(uStack_3c,uVar2))));
  local_58._0_1_ = (undefined1)uVar4;
  local_58._1_1_ = (undefined1)((ulong)uVar4 >> 8);
  local_58._2_1_ = (undefined1)((ulong)uVar4 >> 0x10);
  local_58._3_1_ = (undefined1)((ulong)uVar4 >> 0x18);
  local_58._4_1_ = (undefined1)((ulong)uVar4 >> 0x20);
  local_58._5_1_ = (undefined1)((ulong)uVar4 >> 0x28);
  local_58._6_1_ = (undefined1)((ulong)uVar4 >> 0x30);
  local_58._7_1_ = (undefined1)((ulong)uVar4 >> 0x38);
  local_118 = (undefined1)local_58;
  uStack_117 = 0;
  uStack_116 = local_58._1_1_;
  uStack_115 = 0;
  uStack_114 = local_58._2_1_;
  uStack_113 = 0;
  uStack_112 = local_58._3_1_;
  uStack_111 = 0;
  uStack_110 = local_58._4_1_;
  uStack_10e = local_58._5_1_;
  uStack_10c = local_58._6_1_;
  uStack_10a = local_58._7_1_;
  uVar5 = in_RDI[2];
  uStack_70 = in_RDI[3];
  local_28 = 0;
  uStack_27 = 0;
  uStack_26 = 0;
  uStack_25 = 0;
  local_88 = (ulong)uVar1 << 0x20;
  uStack_80 = CONCAT17(uStack_39,CONCAT16(uStack_3a,CONCAT15(uStack_3b,CONCAT14(uStack_3c,uVar2))));
  local_78._0_1_ = (undefined1)uVar5;
  local_78._1_1_ = (undefined1)((ulong)uVar5 >> 8);
  local_78._2_1_ = (undefined1)((ulong)uVar5 >> 0x10);
  local_78._3_1_ = (undefined1)((ulong)uVar5 >> 0x18);
  local_78._4_1_ = (undefined1)((ulong)uVar5 >> 0x20);
  local_78._5_1_ = (undefined1)((ulong)uVar5 >> 0x28);
  local_78._6_1_ = (undefined1)((ulong)uVar5 >> 0x30);
  local_78._7_1_ = (undefined1)((ulong)uVar5 >> 0x38);
  local_108 = (undefined1)local_78;
  uStack_107 = 0;
  uStack_106 = local_78._1_1_;
  uStack_105 = 0;
  uStack_104 = local_78._2_1_;
  uStack_103 = 0;
  uStack_102 = local_78._3_1_;
  uStack_101 = 0;
  uStack_100 = local_78._4_1_;
  uStack_fe = local_78._5_1_;
  uStack_fc = local_78._6_1_;
  uStack_fa = local_78._7_1_;
  uVar6 = in_RDI[4];
  uStack_90 = in_RDI[5];
  local_38 = 0;
  uStack_37 = 0;
  uStack_36 = 0;
  uStack_35 = 0;
  local_a8 = (ulong)uVar1 << 0x20;
  uStack_a0 = CONCAT17(uStack_39,CONCAT16(uStack_3a,CONCAT15(uStack_3b,CONCAT14(uStack_3c,uVar2))));
  local_98._0_1_ = (undefined1)uVar6;
  local_98._1_1_ = (undefined1)((ulong)uVar6 >> 8);
  local_98._2_1_ = (undefined1)((ulong)uVar6 >> 0x10);
  local_98._3_1_ = (undefined1)((ulong)uVar6 >> 0x18);
  local_98._4_1_ = (undefined1)((ulong)uVar6 >> 0x20);
  local_98._5_1_ = (undefined1)((ulong)uVar6 >> 0x28);
  local_98._6_1_ = (undefined1)((ulong)uVar6 >> 0x30);
  local_98._7_1_ = (undefined1)((ulong)uVar6 >> 0x38);
  local_f8 = (undefined1)local_98;
  uStack_f7 = 0;
  uStack_f6 = local_98._1_1_;
  uStack_f5 = 0;
  uStack_f4 = local_98._2_1_;
  uStack_f3 = 0;
  uStack_f2 = local_98._3_1_;
  uStack_f1 = 0;
  uStack_f0 = local_98._4_1_;
  uStack_ee = local_98._5_1_;
  uStack_ec = local_98._6_1_;
  uStack_ea = local_98._7_1_;
  uVar7 = in_RDI[6];
  uStack_b0 = in_RDI[7];
  local_48 = 0;
  uStack_47 = 0;
  uStack_46 = 0;
  uStack_45 = 0;
  local_c8 = (ulong)uVar1 << 0x20;
  uStack_c0 = CONCAT17(uStack_39,CONCAT16(uStack_3a,CONCAT15(uStack_3b,CONCAT14(uStack_3c,uVar2))));
  local_b8._0_1_ = (undefined1)uVar7;
  local_b8._1_1_ = (undefined1)((ulong)uVar7 >> 8);
  local_b8._2_1_ = (undefined1)((ulong)uVar7 >> 0x10);
  local_b8._3_1_ = (undefined1)((ulong)uVar7 >> 0x18);
  local_b8._4_1_ = (undefined1)((ulong)uVar7 >> 0x20);
  local_b8._5_1_ = (undefined1)((ulong)uVar7 >> 0x28);
  local_b8._6_1_ = (undefined1)((ulong)uVar7 >> 0x30);
  local_b8._7_1_ = (undefined1)((ulong)uVar7 >> 0x38);
  local_e8 = (undefined1)local_b8;
  uStack_e7 = 0;
  uStack_e6 = local_b8._1_1_;
  uStack_e5 = 0;
  uStack_e4 = local_b8._2_1_;
  uStack_e3 = 0;
  uStack_e2 = local_b8._3_1_;
  uStack_e1 = 0;
  uStack_e0 = local_b8._4_1_;
  uStack_de = local_b8._5_1_;
  uStack_dc = local_b8._6_1_;
  uStack_da = local_b8._7_1_;
  uStack_ff = uStack_10f;
  uStack_fd = uStack_10d;
  uStack_fb = uStack_10b;
  uStack_f9 = uStack_109;
  uStack_ef = uStack_10f;
  uStack_ed = uStack_10d;
  uStack_eb = uStack_10b;
  uStack_e9 = uStack_109;
  uStack_df = uStack_10f;
  uStack_dd = uStack_10d;
  uStack_db = uStack_10b;
  uStack_d9 = uStack_109;
  local_b8 = uVar7;
  local_98 = uVar6;
  local_78 = uVar5;
  local_58 = uVar4;
  uStack_44 = uStack_10f;
  uStack_43 = uStack_10d;
  uStack_42 = uStack_10b;
  uStack_41 = uStack_109;
  uStack_34 = uStack_10f;
  uStack_33 = uStack_10d;
  uStack_32 = uStack_10b;
  uStack_31 = uStack_109;
  uStack_30 = uStack_40;
  uStack_2f = uStack_3f;
  uStack_2e = uStack_3e;
  uStack_2d = uStack_3d;
  uStack_2c = uStack_3c;
  uStack_2b = uStack_3b;
  uStack_2a = uStack_3a;
  uStack_29 = uStack_39;
  uStack_24 = uStack_10f;
  uStack_23 = uStack_10d;
  uStack_22 = uStack_10b;
  uStack_21 = uStack_109;
  uStack_20 = uStack_40;
  uStack_1f = uStack_3f;
  uStack_1e = uStack_3e;
  uStack_1d = uStack_3d;
  uStack_1c = uStack_3c;
  uStack_1b = uStack_3b;
  uStack_1a = uStack_3a;
  uStack_19 = uStack_39;
  uStack_14 = uStack_10f;
  uStack_13 = uStack_10d;
  uStack_12 = uStack_10b;
  uStack_11 = uStack_109;
  uStack_10 = uStack_40;
  uStack_f = uStack_3f;
  uStack_e = uStack_3e;
  uStack_d = uStack_3d;
  uStack_c = uStack_3c;
  uStack_b = uStack_3b;
  uStack_a = uStack_3a;
  uStack_9 = uStack_39;
  alVar8 = convolve((__m128i *)&local_118,in_RSI);
  alVar8[0] = alVar8[0];
  alVar8[1] = alVar8[1];
  return alVar8;
}

Assistant:

static inline __m128i convolve_lo_x(const __m128i *const s,
                                    const __m128i *const coeffs) {
  __m128i ss[4];
  ss[0] = _mm_unpacklo_epi8(s[0], _mm_setzero_si128());
  ss[1] = _mm_unpacklo_epi8(s[1], _mm_setzero_si128());
  ss[2] = _mm_unpacklo_epi8(s[2], _mm_setzero_si128());
  ss[3] = _mm_unpacklo_epi8(s[3], _mm_setzero_si128());
  return convolve(ss, coeffs);
}